

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int s_sha1_compress(sha1_state *md,uchar *buf)

{
  uint uVar1;
  ulong32 uVar2;
  ulong32 uVar3;
  ulong32 uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong32 uVar8;
  ulong32 uVar9;
  long lVar10;
  uint uVar11;
  ulong32 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
    uVar1 = *(uint *)(buf + lVar10 * 4);
    auStack_184[lVar10 + 3] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar2 = md->state[0];
  uVar3 = md->state[1];
  uVar4 = md->state[2];
  uVar1 = md->state[3];
  uVar5 = md->state[4];
  for (lVar10 = 0x10; lVar10 != 0x50; lVar10 = lVar10 + 1) {
    uVar13 = auStack_198[lVar10] ^ auStack_184[lVar10] ^ auStack_1b8[lVar10 + 2] ^
             auStack_1b8[lVar10];
    auStack_184[lVar10 + 3] = uVar13 << 1 | (uint)((int)uVar13 < 0);
  }
  uVar8 = uVar2;
  uVar12 = uVar3;
  uVar9 = uVar4;
  uVar13 = uVar1;
  uVar14 = uVar5;
  for (lVar10 = 0; uVar11 = uVar13, uVar13 = uVar9, uVar18 = uVar8, lVar10 != 0x14;
      lVar10 = lVar10 + 1) {
    lVar7 = lVar10 + 3;
    uVar15 = uVar12 << 0x1e;
    uVar6 = uVar12 >> 2;
    uVar8 = (uVar18 << 5 | uVar18 >> 0x1b) + uVar14 + ((uVar11 ^ uVar13) & uVar12 ^ uVar11) +
            auStack_184[lVar7] + 0x5a827999;
    uVar12 = uVar18;
    uVar9 = uVar15 | uVar6;
    uVar14 = uVar11;
  }
  for (lVar10 = 0x14; uVar15 = uVar13, lVar10 != 0x28; lVar10 = lVar10 + 1) {
    lVar7 = lVar10 + 3;
    iVar17 = (uVar15 ^ uVar12 ^ uVar11) + (uVar18 << 5 | uVar18 >> 0x1b) + uVar14;
    uVar13 = uVar12 << 0x1e;
    uVar14 = uVar12 >> 2;
    uVar12 = uVar18;
    uVar13 = uVar13 | uVar14;
    uVar14 = uVar11;
    uVar18 = iVar17 + auStack_184[lVar7] + 0x6ed9eba1;
    uVar11 = uVar15;
  }
  for (lVar10 = 0x28; lVar10 != 0x3c; lVar10 = lVar10 + 1) {
    uVar19 = uVar15 & uVar12;
    uVar16 = uVar15 | uVar12;
    lVar7 = lVar10 + 3;
    iVar17 = (uVar18 << 5 | uVar18 >> 0x1b) + uVar14;
    uVar13 = uVar12 << 0x1e;
    uVar6 = uVar12 >> 2;
    uVar12 = uVar18;
    uVar14 = uVar11;
    uVar18 = auStack_184[lVar7] + iVar17 + (uVar16 & uVar11 | uVar19) + 0x8f1bbcdc;
    uVar11 = uVar15;
    uVar15 = uVar13 | uVar6;
  }
  lVar10 = 0x3c;
  while( true ) {
    if (lVar10 == 0x50) break;
    lVar7 = lVar10 + 3;
    lVar10 = lVar10 + 1;
    iVar17 = (uVar15 ^ uVar12 ^ uVar11) + (uVar18 << 5 | uVar18 >> 0x1b) + uVar14;
    uVar13 = uVar12 << 0x1e;
    uVar6 = uVar12 >> 2;
    uVar12 = uVar18;
    uVar14 = uVar11;
    uVar18 = iVar17 + auStack_184[lVar7] + 0xca62c1d6;
    uVar11 = uVar15;
    uVar15 = uVar13 | uVar6;
  }
  md->state[0] = uVar18 + uVar2;
  md->state[1] = uVar12 + uVar3;
  md->state[2] = uVar15 + uVar4;
  md->state[3] = uVar11 + uVar1;
  md->state[4] = uVar14 + uVar5;
  return uVar5;
}

Assistant:

static int s_sha1_compress(struct sha1_state *md, const unsigned char *buf)
{
    ulong32 a,b,c,d,e,W[80],i;
    ulong32 t;

    /* copy the state into 512-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD32H(W[i], buf + (4*i));
    }

    /* copy state */
    a = md->state[0];
    b = md->state[1];
    c = md->state[2];
    d = md->state[3];
    e = md->state[4];

    /* expand it */
    for (i = 16; i < 80; i++) {
        W[i] = ROL(W[i-3] ^ W[i-8] ^ W[i-14] ^ W[i-16], 1);
    }

    /* compress */
    /* round one */
    #define FF0(a,b,c,d,e,i) e = (ROLc(a, 5) + F0(b,c,d) + e + W[i] + 0x5a827999UL); b = ROLc(b, 30);
    #define FF1(a,b,c,d,e,i) e = (ROLc(a, 5) + F1(b,c,d) + e + W[i] + 0x6ed9eba1UL); b = ROLc(b, 30);
    #define FF2(a,b,c,d,e,i) e = (ROLc(a, 5) + F2(b,c,d) + e + W[i] + 0x8f1bbcdcUL); b = ROLc(b, 30);
    #define FF3(a,b,c,d,e,i) e = (ROLc(a, 5) + F3(b,c,d) + e + W[i] + 0xca62c1d6UL); b = ROLc(b, 30);

    for (i = 0; i < 20; ) {
       FF0(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 40; ) {
       FF1(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 60; ) {
       FF2(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 80; ) {
       FF3(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }

    #undef FF0
    #undef FF1
    #undef FF2
    #undef FF3

    /* store */
    md->state[0] = md->state[0] + a;
    md->state[1] = md->state[1] + b;
    md->state[2] = md->state[2] + c;
    md->state[3] = md->state[3] + d;
    md->state[4] = md->state[4] + e;

    return 0;
}